

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e0a3::BuildEngineTest_StatusCallbacks_Test::
~BuildEngineTest_StatusCallbacks_Test(BuildEngineTest_StatusCallbacks_Test *this)

{
  BuildEngineTest_StatusCallbacks_Test *this_local;
  
  ~BuildEngineTest_StatusCallbacks_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BuildEngineTest, StatusCallbacks) {
  unsigned numScanned = 0;
  unsigned numComplete = 0;
  SimpleBuildEngineDelegate delegate;
  core::BuildEngine engine(delegate);
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
      "input", {}, [&] (const std::vector<int>& inputs) {
          return 2; },
      nullptr,
      [&] (core::Rule::StatusKind status) {
        if (status == core::Rule::StatusKind::IsScanning) {
          ++numScanned;
        } else {
          assert(status == core::Rule::StatusKind::IsComplete);
          ++numComplete;
        }
      } )));
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
      "output", {"input"},
                   [&] (const std::vector<int>& inputs) {
                     return inputs[0] * 3;
                   },
      nullptr,
      [&] (core::Rule::StatusKind status) {
        if (status == core::Rule::StatusKind::IsScanning) {
          ++numScanned;
        } else {
          assert(status == core::Rule::StatusKind::IsComplete);
          ++numComplete;
        }
      } )));

  // Build the result.
  EXPECT_EQ(2 * 3, intFromValue(engine.build("output")));
  EXPECT_EQ(2U, numScanned);
  EXPECT_EQ(2U, numComplete);
}